

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree.c
# Opt level: O0

size_t kvtree_pack(char *buf,kvtree *hash)

{
  __uint32_t _Var1;
  size_t sVar2;
  uint32_t count_network_1;
  uint32_t count_network;
  uint32_t count;
  kvtree_elem *elem;
  size_t size;
  kvtree *hash_local;
  char *buf_local;
  
  if (hash == (kvtree *)0x0) {
    _Var1 = __bswap_32(0);
    *(__uint32_t *)buf = _Var1;
    elem = (kvtree_elem *)0x4;
  }
  else {
    count_network_1 = 0;
    for (_count_network = hash->lh_first; _count_network != (kvtree_elem_struct *)0x0;
        _count_network = (_count_network->pointers).le_next) {
      count_network_1 = count_network_1 + 1;
    }
    _Var1 = __bswap_32(count_network_1);
    *(__uint32_t *)buf = _Var1;
    elem = (kvtree_elem *)0x4;
    for (_count_network = hash->lh_first; _count_network != (kvtree_elem *)0x0;
        _count_network = (_count_network->pointers).le_next) {
      sVar2 = kvtree_elem_pack(buf + (long)elem,_count_network);
      elem = (kvtree_elem *)((long)&elem->key + sVar2);
    }
  }
  return (size_t)elem;
}

Assistant:

size_t kvtree_pack(char* buf, const kvtree* hash)
{
  size_t size = 0;
  if (hash != NULL) {
    kvtree_elem* elem;

    /* count the items in the hash */
    uint32_t count = 0;
    LIST_FOREACH(elem, hash, pointers) {
      count++;
    }

    /* pack the count value */
    uint32_t count_network = kvtree_hton32(count);
    memcpy(buf + size, &count_network, sizeof(uint32_t));
    size += sizeof(uint32_t);

    /* pack each element */
    LIST_FOREACH(elem, hash, pointers) {
      size += kvtree_elem_pack(buf + size, elem);
    }
  } else {
    /* no hash -- just pack the count of 0 */
    uint32_t count_network = kvtree_hton32((uint32_t) 0);
    memcpy(buf + size, &count_network, sizeof(uint32_t));
    size += sizeof(uint32_t);
  }
  return size;
}